

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O0

nsync_time nsync::nsync_note_notified_deadline_(nsync_note n)

{
  nsync_time a;
  uint uVar1;
  int iVar2;
  nsync_time nVar3;
  nsync_time *local_70;
  nsync_time *local_68;
  nsync_note n_local;
  nsync_time ntime;
  
  uVar1 = std::atomic_load_explicit<unsigned_int>(&n->notified,memory_order_acquire);
  if (uVar1 == 0) {
    nsync_mu_lock(&n->note_mu);
    uVar1 = std::atomic_load_explicit<unsigned_int>(&n->notified,memory_order_acquire);
    if (uVar1 == 0) {
      if (n->expiry_time_valid == 0) {
        local_70 = (nsync_time *)&nsync_time_no_deadline;
      }
      else {
        local_70 = &n->expiry_time;
      }
      local_68 = local_70;
    }
    else {
      local_68 = (nsync_time *)&nsync_time_zero;
    }
    n_local = (nsync_note)local_68->tv_sec;
    ntime.tv_sec = local_68->tv_nsec;
    a = *local_68;
    nVar3 = *local_68;
    nsync_mu_unlock(&n->note_mu);
    iVar2 = nsync_time_cmp(nVar3,(nsync_time)ZEXT816(0));
    if (0 < iVar2) {
      nVar3 = nsync_time_now();
      iVar2 = nsync_time_cmp(a,nVar3);
      if (iVar2 < 1) {
        notify(n);
        n_local = (nsync_note)0x0;
        ntime.tv_sec = 0;
      }
    }
  }
  else {
    n_local = (nsync_note)0x0;
    ntime.tv_sec = 0;
  }
  nVar3.tv_nsec = ntime.tv_sec;
  nVar3.tv_sec = (__time_t)n_local;
  return nVar3;
}

Assistant:

nsync_time nsync_note_notified_deadline_ (nsync_note n) {
	nsync_time ntime;
	if (ATM_LOAD_ACQ (&n->notified) != 0) {
		ntime = nsync_time_zero;
	} else {
		nsync_mu_lock (&n->note_mu);
		ntime = NOTIFIED_TIME (n);
		nsync_mu_unlock (&n->note_mu);
		if (nsync_time_cmp (ntime, nsync_time_zero) > 0) {
			if (nsync_time_cmp (ntime, nsync_time_now ()) <= 0) {
				notify (n);
				ntime = nsync_time_zero;
			}
		}
	}
	return (ntime);
}